

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int execute_filter(archive_read *a,rar_filter *filter,rar_virtual_machine *vm,size_t pos)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint64_t uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint8_t *puVar13;
  long lVar14;
  uint8_t byte;
  byte bVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint8_t *puVar20;
  uint8_t uVar21;
  char cVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  uint8_t *puVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  int local_ac;
  int local_78 [4];
  int local_68 [7];
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  uint uStack_3c;
  byte local_38;
  undefined3 uStack_37;
  
  uVar4 = filter->prog->fingerprint;
  if (uVar4 == 0xd8bc85e701) {
    uVar3 = filter->initialregisters[4];
    if (0x1e000 < (ulong)uVar3) {
      return 0;
    }
    uVar30 = filter->initialregisters[0];
    puVar13 = vm->memory;
    uVar19 = 0;
    do {
      if (uVar19 == uVar30) {
        filter->filteredblockaddress = uVar3;
        filter->filteredblocklength = uVar3;
        return 1;
      }
      local_48 = 0;
      uStack_44 = 0;
      uStack_40 = 0;
      uStack_4c = 0;
      local_68[0] = 0;
      local_68[1] = 0;
      local_68[2] = 0;
      local_68[3] = 0;
      local_ac = 0;
      local_68[5] = 0;
      local_68[4] = 0;
      cVar7 = '\0';
      cVar5 = '\0';
      cVar22 = '\0';
      cVar6 = '\0';
      uVar12 = 0;
      iVar8 = 0;
      uVar31 = 0;
      uVar28 = 0;
      for (uVar25 = uVar19; uVar25 < uVar3; uVar25 = uVar25 + uVar30) {
        if (vm->memory + uVar3 <= puVar13) {
          return 0;
        }
        iVar16 = (int)(char)*puVar13;
        iVar32 = (int)cVar22;
        uVar27 = iVar32 - iVar8;
        local_38 = (char)((int)cVar7 * (uVar12 & 0xffff) + uVar31 * 8 + cVar6 * iVar32 +
                          (int)cVar5 * uVar27 >> 3) - *puVar13;
        uVar17 = iVar16 * 8;
        uVar9 = iVar32 + iVar16 * 8;
        uVar10 = uVar17 - (int)(short)uVar27;
        iVar8 = (int)(short)uVar27 + iVar16 * 8;
        iVar18 = -iVar8;
        if (0 < iVar8) {
          iVar18 = iVar8;
        }
        local_68[4] = iVar18 + local_68[4];
        iVar18 = uVar17 - (int)(short)uVar12;
        iVar8 = -iVar18;
        if (0 < iVar18) {
          iVar8 = iVar18;
        }
        local_68[5] = iVar8 + local_68[5];
        iVar8 = (int)(short)uVar12 + iVar16 * 8;
        iVar18 = -iVar8;
        if (0 < iVar8) {
          iVar18 = iVar8;
        }
        uVar12 = (int)(uVar17 - iVar32) >> 0x1f;
        uVar33 = (int)uVar9 >> 0x1f;
        uVar34 = (int)uVar10 >> 0x1f;
        local_68[0] = ((uVar17 ^ (int)uVar17 >> 0x1f) - ((int)uVar17 >> 0x1f)) + local_68[0];
        local_68[1] = ((uVar17 - iVar32 ^ uVar12) - uVar12) + local_68[1];
        local_68[2] = ((uVar9 ^ uVar33) - uVar33) + local_68[2];
        local_68[3] = ((uVar10 ^ uVar34) - uVar34) + local_68[3];
        local_ac = iVar18 + local_ac;
        local_68[6] = local_ac;
        cVar22 = local_38 - (char)uVar31;
        uStack_37 = 0;
        (vm->memory + uVar3)[uVar25] = local_38;
        uStack_3c = uVar28 + 1;
        if ((uVar28 & 0x1f) == 0) {
          uVar11 = 0;
          for (lVar23 = 5; lVar23 != 0xb; lVar23 = lVar23 + 1) {
            if (local_78[lVar23] < local_68[uVar11]) {
              uVar11 = (ulong)((int)lVar23 - 4U & 0xff);
            }
          }
          local_48 = 0;
          uStack_44 = 0;
          uStack_40 = 0;
          uStack_4c = 0;
          local_68[0] = 0;
          local_68[1] = 0;
          local_68[2] = 0;
          local_68[3] = 0;
          local_ac = 0;
          switch((int)uVar11) {
          case 1:
            if (-0x11 < cVar6) {
              cVar6 = cVar6 + -1;
            }
            break;
          case 2:
            if (cVar6 < '\x10') {
              cVar6 = cVar6 + '\x01';
            }
            break;
          case 3:
            if (-0x11 < cVar5) {
              cVar5 = cVar5 + -1;
            }
            break;
          case 4:
            if (cVar5 < '\x10') {
              cVar5 = cVar5 + '\x01';
            }
            break;
          case 5:
            if (-0x11 < cVar7) {
              cVar7 = cVar7 + -1;
            }
            break;
          case 6:
            if (cVar7 < '\x10') {
              cVar7 = cVar7 + '\x01';
            }
          }
          local_68[5] = 0;
          local_68[4] = 0;
        }
        puVar13 = puVar13 + 1;
        uVar12 = uVar27;
        iVar8 = iVar32;
        uVar31 = (uint)local_38;
        uVar28 = uVar28 + 1;
      }
      uVar19 = uVar19 + 1;
    } while( true );
  }
  if (uVar4 == 0x35ad576887) {
    iVar8 = 0;
  }
  else {
    if (uVar4 != 0x393cd7e57e) {
      if (uVar4 == 0x951c2c5dc8) {
        uVar3 = filter->initialregisters[4];
        uVar11 = (ulong)uVar3;
        if (0x1e000 < uVar11) {
          return 0;
        }
        uVar24 = (ulong)filter->initialregisters[1];
        if ((filter->initialregisters[1] < 3 && 2 < uVar3) && filter->initialregisters[0] <= uVar3)
        {
          puVar13 = vm->memory;
          puVar20 = vm->memory + uVar11;
          lVar23 = (long)puVar20 - (ulong)filter->initialregisters[0];
          lVar26 = 0;
          puVar29 = puVar20;
          do {
            if (lVar26 == 3) {
              for (; uVar24 < uVar3 - 2; uVar24 = uVar24 + 3) {
                uVar21 = vm->memory[uVar24 + uVar11 + 1];
                vm->memory[uVar24 + uVar11] = vm->memory[uVar24 + uVar11] + uVar21;
                vm->memory[uVar24 + uVar11 + 2] = vm->memory[uVar24 + uVar11 + 2] + uVar21;
              }
              filter->filteredblockaddress = uVar3;
              filter->filteredblocklength = uVar3;
              return 1;
            }
            bVar15 = 0;
            for (lVar14 = 0; (ulong)(lVar26 + lVar14) < uVar11; lVar14 = lVar14 + 3) {
              if (puVar20 <= puVar13) {
                return 0;
              }
              if (puVar20 <= (char *)(lVar23 + lVar14)) {
                bVar1 = *(byte *)(lVar23 + 3 + lVar14);
                bVar2 = *(byte *)(lVar23 + lVar14);
                uVar19 = (uint)bVar1 - (uint)bVar2;
                uVar30 = -uVar19;
                if (0 < (int)uVar19) {
                  uVar30 = uVar19;
                }
                uVar12 = (uint)bVar15 - (uint)bVar2;
                uVar25 = -uVar12;
                if (0 < (int)uVar12) {
                  uVar25 = uVar12;
                }
                uVar12 = uVar12 + uVar19;
                uVar19 = -uVar12;
                if (0 < (int)uVar12) {
                  uVar19 = uVar12;
                }
                if ((((uVar25 & 0xff) < (uVar30 & 0xff)) || (uVar19 < (uVar30 & 0xff))) &&
                   (bVar15 = bVar2, (uVar25 & 0xff) <= uVar19)) {
                  bVar15 = bVar1;
                }
              }
              bVar15 = bVar15 - *puVar13;
              puVar13 = puVar13 + 1;
              puVar29[lVar14] = bVar15;
            }
            lVar26 = lVar26 + 1;
            puVar29 = puVar29 + 1;
            lVar23 = lVar23 + 1;
          } while( true );
        }
        return 0;
      }
      if (uVar4 != 0x1d0e06077d) {
        archive_set_error(&a->archive,0x54,"No support for RAR VM program filter");
        return 0;
      }
      uVar3 = filter->initialregisters[4];
      if ((ulong)uVar3 < 0x1e001) {
        uVar30 = filter->initialregisters[0];
        puVar13 = vm->memory;
        uVar19 = 0;
        do {
          if (uVar19 == uVar30) {
            filter->filteredblockaddress = uVar3;
            filter->filteredblocklength = uVar3;
            return 1;
          }
          uVar21 = '\0';
          for (uVar25 = uVar19; uVar25 < uVar3; uVar25 = uVar25 + uVar30) {
            if (vm->memory + uVar3 <= puVar13) {
              return 0;
            }
            uVar21 = uVar21 - *puVar13;
            puVar13 = puVar13 + 1;
            (vm->memory + uVar3)[uVar25] = uVar21;
          }
          uVar19 = uVar19 + 1;
        } while( true );
      }
      return 0;
    }
    iVar8 = 1;
  }
  iVar8 = execute_filter_e8(filter,vm,pos,iVar8);
  return iVar8;
}

Assistant:

static int
execute_filter(struct archive_read *a, struct rar_filter *filter, struct rar_virtual_machine *vm, size_t pos)
{
  if (filter->prog->fingerprint == 0x1D0E06077D)
    return execute_filter_delta(filter, vm);
  if (filter->prog->fingerprint == 0x35AD576887)
    return execute_filter_e8(filter, vm, pos, 0);
  if (filter->prog->fingerprint == 0x393CD7E57E)
    return execute_filter_e8(filter, vm, pos, 1);
  if (filter->prog->fingerprint == 0x951C2C5DC8)
    return execute_filter_rgb(filter, vm);
  if (filter->prog->fingerprint == 0xD8BC85E701)
    return execute_filter_audio(filter, vm);

  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT, "No support for RAR VM program filter");
  return 0;
}